

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

void __thiscall
helics::Federate::setModeUpdateCallback
          (Federate *this,
          function<void_(helics::Federate::Modes,_helics::Federate::Modes)> *callback)

{
  string_view message;
  Modes MVar1;
  undefined8 uVar2;
  function<void_(helics::Federate::Modes,_helics::Federate::Modes)> *in_RSI;
  char *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffe0;
  function<void_(helics::Federate::Modes,_helics::Federate::Modes)> *in_stack_ffffffffffffffe8;
  
  MVar1 = std::atomic::operator_cast_to_Modes((atomic<helics::Federate::Modes> *)0x209496);
  if (MVar1 != PENDING_ITERATIVE_TIME) {
    MVar1 = std::atomic::operator_cast_to_Modes((atomic<helics::Federate::Modes> *)0x2094a8);
    if (MVar1 != PENDING_TIME) {
      MVar1 = std::atomic::operator_cast_to_Modes((atomic<helics::Federate::Modes> *)0x2094ba);
      if (MVar1 != PENDING_EXEC) {
        MVar1 = std::atomic::operator_cast_to_Modes((atomic<helics::Federate::Modes> *)0x2094cc);
        if (MVar1 != PENDING_INIT) {
          MVar1 = std::atomic::operator_cast_to_Modes((atomic<helics::Federate::Modes> *)0x2094de);
          if (MVar1 != PENDING_FINALIZE) {
            std::function<void_(helics::Federate::Modes,_helics::Federate::Modes)>::operator=
                      (in_RSI,in_stack_ffffffffffffffe8);
            return;
          }
        }
      }
    }
  }
  uVar2 = __cxa_allocate_exception(0x28);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffffe0,in_RDI);
  message._M_str = (char *)in_RSI;
  message._M_len = (size_t)in_stack_ffffffffffffffe8;
  InvalidFunctionCall::InvalidFunctionCall((InvalidFunctionCall *)in_stack_ffffffffffffffe0,message)
  ;
  __cxa_throw(uVar2,&InvalidFunctionCall::typeinfo,InvalidFunctionCall::~InvalidFunctionCall);
}

Assistant:

void Federate::setModeUpdateCallback(std::function<void(Modes, Modes)> callback)
{
    if (currentMode == Modes::PENDING_ITERATIVE_TIME || currentMode == Modes::PENDING_TIME ||
        currentMode == Modes::PENDING_EXEC || currentMode == Modes::PENDING_INIT ||
        currentMode == Modes::PENDING_FINALIZE) {
        throw(InvalidFunctionCall(
            "cannot update mode update callback during an async operation"));  // LCOV_EXCL_LINE
    }
    modeUpdateCallback = std::move(callback);
}